

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64rapass.cpp
# Opt level: O2

void __thiscall asmjit::_abi_1_10::a64::ARMRAPass::onInit(ARMRAPass *this)

{
  RARegMask *this_00;
  Array<unsigned_char,_2UL> *this_01;
  Arch AVar1;
  byte bVar2;
  uint32_t uVar3;
  BaseBuilder *pBVar4;
  BaseReg *pBVar5;
  uint *puVar6;
  uchar *puVar7;
  RegGroup local_34 [4];
  int local_30 [2];
  
  pBVar4 = (this->super_BaseRAPass).super_FuncPass.super_Pass._cb;
  AVar1 = (pBVar4->super_BaseEmitter)._environment._arch;
  (this->_emitHelper).super_BaseEmitHelper._emitter = &pBVar4->super_BaseEmitter;
  (this->super_BaseRAPass)._archTraits = (ArchTraits *)(_archTraits + (ulong)AVar1 * 0xd8);
  (this->super_BaseRAPass)._physRegCount.field_0._packed = 0x2020;
  BaseRAPass::_buildPhysIndex(&this->super_BaseRAPass);
  uVar3 = (this->super_BaseRAPass)._physRegCount.field_0._packed;
  (this->super_BaseRAPass)._availableRegCount.field_0._packed = uVar3;
  this_00 = &(this->super_BaseRAPass)._availableRegs;
  local_34[3] = 0;
  puVar6 = Support::Array<unsigned_int,_4UL>::operator[]<asmjit::_abi_1_10::RegGroup>
                     (&this_00->_masks,local_34 + 3);
  *puVar6 = ~(uint)(-1L << ((byte)uVar3 & 0x3f));
  bVar2 = (this->super_BaseRAPass)._physRegCount.field_0._regs[1];
  local_34[2] = 1;
  puVar6 = Support::Array<unsigned_int,_4UL>::operator[]<asmjit::_abi_1_10::RegGroup>
                     (&this_00->_masks,local_34 + 2);
  *puVar6 = ~(uint)(-1L << (bVar2 & 0x3f));
  bVar2 = (this->super_BaseRAPass)._physRegCount.field_0._regs[2];
  local_34[1] = 3;
  puVar6 = Support::Array<unsigned_int,_4UL>::operator[]<asmjit::_abi_1_10::RegGroup>
                     (&this_00->_masks,local_34 + 1);
  *puVar6 = ~(uint)(-1L << (bVar2 & 0x3f));
  bVar2 = (this->super_BaseRAPass)._physRegCount.field_0._regs[3];
  local_34[0] = kExtraVirt3;
  puVar6 = Support::Array<unsigned_int,_4UL>::operator[]<asmjit::_abi_1_10::RegGroup>
                     (&this_00->_masks,local_34);
  *puVar6 = ~(uint)(-1L << (bVar2 & 0x3f));
  this_01 = &(this->super_BaseRAPass)._scratchRegIndexes;
  local_30[1] = 0;
  puVar7 = Support::Array<unsigned_char,_2UL>::operator[]<int>(this_01,local_30 + 1);
  *puVar7 = '\x1b';
  local_30[0] = 1;
  puVar7 = Support::Array<unsigned_char,_2UL>::operator[]<int>(this_01,local_30);
  *puVar7 = '\x1c';
  if (((((this->super_BaseRAPass)._func)->_frame)._attributes & kHasPreservedFP) != kNoAttributes) {
    BaseRAPass::makeUnavailable(&this->super_BaseRAPass,k0,0x1d);
  }
  BaseRAPass::makeUnavailable(&this->super_BaseRAPass,k0,0x1f);
  BaseRAPass::makeUnavailable(&this->super_BaseRAPass,k0,0x12);
  (this->super_BaseRAPass)._sp.super_Operand.super_Operand_._signature = 0x8000039;
  (this->super_BaseRAPass)._sp.super_Operand.super_Operand_._baseId = 0x1f;
  pBVar5 = &(this->super_BaseRAPass)._sp;
  (pBVar5->super_Operand).super_Operand_._data[0] = 0;
  (pBVar5->super_Operand).super_Operand_._data[1] = 0;
  (this->super_BaseRAPass)._fp.super_Operand.super_Operand_._signature = 0x8000039;
  (this->super_BaseRAPass)._fp.super_Operand.super_Operand_._baseId = 0x1d;
  pBVar5 = &(this->super_BaseRAPass)._fp;
  (pBVar5->super_Operand).super_Operand_._data[0] = 0;
  (pBVar5->super_Operand).super_Operand_._data[1] = 0;
  return;
}

Assistant:

void ARMRAPass::onInit() noexcept {
  Arch arch = cc()->arch();

  _emitHelper._emitter = _cb;

  _archTraits = &ArchTraits::byArch(arch);
  _physRegCount.set(RegGroup::kGp, 32);
  _physRegCount.set(RegGroup::kVec, 32);
  _physRegCount.set(RegGroup::kExtraVirt2, 0);
  _physRegCount.set(RegGroup::kExtraVirt3, 0);
  _buildPhysIndex();

  _availableRegCount = _physRegCount;
  _availableRegs[RegGroup::kGp] = Support::lsbMask<uint32_t>(_physRegCount.get(RegGroup::kGp));
  _availableRegs[RegGroup::kVec] = Support::lsbMask<uint32_t>(_physRegCount.get(RegGroup::kVec));
  _availableRegs[RegGroup::kExtraVirt3] = Support::lsbMask<uint32_t>(_physRegCount.get(RegGroup::kExtraVirt2));
  _availableRegs[RegGroup::kExtraVirt3] = Support::lsbMask<uint32_t>(_physRegCount.get(RegGroup::kExtraVirt3));

  _scratchRegIndexes[0] = uint8_t(27);
  _scratchRegIndexes[1] = uint8_t(28);

  // The architecture specific setup makes implicitly all registers available. So
  // make unavailable all registers that are special and cannot be used in general.
  bool hasFP = _func->frame().hasPreservedFP();

  if (hasFP)
    makeUnavailable(RegGroup::kGp, Gp::kIdFp);

  makeUnavailable(RegGroup::kGp, Gp::kIdSp);
  makeUnavailable(RegGroup::kGp, Gp::kIdOs); // OS-specific use, usually TLS.

  _sp = sp;
  _fp = x29;
}